

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O1

bool __thiscall ParsedJson::iterator::print(iterator *this,ostream *os,bool escape_strings)

{
  ostream *poVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  ostream oVar6;
  undefined8 in_RAX;
  size_t sVar7;
  long lVar8;
  fmtflags __old;
  char *pcVar9;
  byte *pbVar10;
  double dVar11;
  undefined8 uStack_38;
  
  uVar4 = this->location;
  if (this->tape_length <= uVar4) {
    return false;
  }
  bVar2 = this->current_type;
  uStack_38._0_7_ = (undefined7)in_RAX;
  uStack_38 = in_RAX;
  if (0x6b < bVar2) {
    if (bVar2 < 0x74) {
      if (bVar2 == 0x6c) {
        std::ostream::_M_insert<long>((long)os);
        return true;
      }
      if (bVar2 != 0x6e) {
        return false;
      }
      pcVar9 = "null";
    }
    else {
      if (bVar2 != 0x74) {
        if ((bVar2 != 0x7b) && (bVar2 != 0x7d)) {
          return false;
        }
        goto LAB_00108393;
      }
      pcVar9 = "true";
    }
    lVar8 = 4;
    goto LAB_001085b1;
  }
  if (bVar2 < 0x5d) {
    if (bVar2 != 0x22) {
      if (bVar2 != 0x5b) {
        return false;
      }
      goto LAB_00108393;
    }
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    puVar5 = this->pj->string_buf;
    if (escape_strings) {
      pbVar10 = puVar5 + (this->current_val & 0xffffffffffffff);
      pcVar9 = (char *)((long)&uStack_38 + 7);
      do {
        bVar2 = *pbVar10;
        switch(bVar2) {
        case 0:
          goto switchD_0010858c_caseD_0;
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 6:
        case 7:
        case 0xb:
switchD_0010858c_caseD_1:
          if (0x1f < bVar2) {
            uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
            break;
          }
          lVar8 = *(long *)os;
          uVar3 = *(uint *)(os + *(long *)(lVar8 + -0x18) + 0x18);
          *(uint *)(os + *(long *)(lVar8 + -0x18) + 0x18) = uVar3 & 0xffffffb5 | 8;
          *(undefined8 *)(os + *(long *)(lVar8 + -0x18) + 0x10) = 4;
          poVar1 = os + *(long *)(lVar8 + -0x18);
          if (os[*(long *)(lVar8 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar6 = (ostream)std::ios::widen((char)poVar1);
            poVar1[0xe0] = oVar6;
            poVar1[0xe1] = (ostream)0x1;
          }
          poVar1[0xe0] = (ostream)0x30;
          std::ostream::operator<<((ostream *)os,(uint)*pbVar10);
          *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar3;
          goto LAB_00108573;
        case 8:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
          uStack_38 = CONCAT17(0x62,(undefined7)uStack_38);
          break;
        case 9:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
          uStack_38 = CONCAT17(0x74,(undefined7)uStack_38);
          break;
        case 10:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
          uStack_38 = CONCAT17(0x6e,(undefined7)uStack_38);
          break;
        case 0xc:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
          uStack_38 = CONCAT17(0x66,(undefined7)uStack_38);
          break;
        case 0xd:
          uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
          uStack_38 = CONCAT17(0x72,(undefined7)uStack_38);
          break;
        default:
          if (bVar2 == 0x22) {
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
            uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
          }
          else {
            if (bVar2 != 0x5c) goto switchD_0010858c_caseD_1;
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
            uStack_38 = CONCAT17(0x5c,(undefined7)uStack_38);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,1);
LAB_00108573:
        pbVar10 = pbVar10 + 1;
      } while( true );
    }
    if (puVar5 == (uint8_t *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      uVar4 = this->current_val;
      sVar7 = strlen((char *)(puVar5 + (uVar4 & 0xffffffffffffff)));
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)(puVar5 + (uVar4 & 0xffffffffffffff)),sVar7);
    }
switchD_0010858c_caseD_0:
    uStack_38 = CONCAT17(0x22,(undefined7)uStack_38);
  }
  else {
    if (bVar2 != 0x5d) {
      if (bVar2 == 100) {
        if (uVar4 + 1 < this->tape_length) {
          dVar11 = (double)this->pj->tape[uVar4 + 1];
        }
        else {
          dVar11 = NAN;
        }
        std::ostream::_M_insert<double>(dVar11);
        return true;
      }
      if (bVar2 != 0x66) {
        return false;
      }
      pcVar9 = "false";
      lVar8 = 5;
      goto LAB_001085b1;
    }
LAB_00108393:
    uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
  }
  pcVar9 = (char *)((long)&uStack_38 + 7);
  lVar8 = 1;
LAB_001085b1:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar9,lVar8);
  return true;
}

Assistant:

bool ParsedJson::iterator::print(std::ostream &os, bool escape_strings) const {
    if(!isOk()) { return false;
}
    switch (current_type) {
    case '"': // we have a string
    os << '"';
    if(escape_strings) {
        print_with_escapes(get_string(), os);
    } else {
        os << get_string();
    }
    os << '"';
    break;
    case 'l': // we have a long int
    os << get_integer();
    break;
    case 'd':
    os << get_double();
    break;
    case 'n': // we have a null
    os << "null";
    break;
    case 't': // we have a true
    os << "true";
    break;
    case 'f': // we have a false
    os << "false";
    break;
    case '{': // we have an object
    case '}': // we end an object
    case '[': // we start an array
    case ']': // we end an array
    os << static_cast<char>(current_type);
    break;
    default:
    return false;
    }
    return true;
}